

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O0

void Curl_pollset_set(Curl_easy *data,easy_pollset *ps,curl_socket_t sock,_Bool do_in,_Bool do_out)

{
  uint uVar1;
  uint uVar2;
  _Bool do_out_local;
  _Bool do_in_local;
  curl_socket_t sock_local;
  easy_pollset *ps_local;
  Curl_easy *data_local;
  
  uVar1 = 0;
  if (do_out) {
    uVar1 = 2;
  }
  uVar2 = 0;
  if (((do_out ^ 0xffU) & 1) != 0) {
    uVar2 = 2;
  }
  Curl_pollset_change(data,ps,sock,do_in | uVar1,((do_in ^ 0xffU) & 1) != 0 | uVar2);
  return;
}

Assistant:

void Curl_pollset_set(struct Curl_easy *data,
                      struct easy_pollset *ps, curl_socket_t sock,
                      bool do_in, bool do_out)
{
  Curl_pollset_change(data, ps, sock,
                      (do_in ? CURL_POLL_IN : 0)|
                      (do_out ? CURL_POLL_OUT : 0),
                      (!do_in ? CURL_POLL_IN : 0)|
                      (!do_out ? CURL_POLL_OUT : 0));
}